

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O0

boolean can_saddle(monst *mtmp)

{
  permonst *ppVar1;
  char *pcVar2;
  byte local_19;
  permonst *ptr;
  monst *mtmp_local;
  
  ppVar1 = mtmp->data;
  pcVar2 = strchr("\x11\x15\x1b\x1d\x1e$",(int)ppVar1->mlet);
  local_19 = 0;
  if (((((pcVar2 != (char *)0x0) && (local_19 = 0, 1 < ppVar1->msize)) &&
       (((ppVar1->mflags1 & 0x20000) == 0 || (local_19 = 0, ppVar1->mlet == '\x1d')))) &&
      (((local_19 = 0, (ppVar1->mflags1 & 4) == 0 && (local_19 = 0, ppVar1->mlet != '6')) &&
       (local_19 = 0, ppVar1->mlet != '\x16')))) && (local_19 = 0, ppVar1 != mons + 0x9f)) {
    local_19 = (ppVar1->mflags1 & 0x100000) != 0 ^ 0xff;
  }
  return local_19 & 1;
}

Assistant:

boolean can_saddle(struct monst *mtmp)
{
	const struct permonst *ptr = mtmp->data;

	return (strchr(steeds, ptr->mlet) && (ptr->msize >= MZ_MEDIUM) &&
			(!humanoid(ptr) || ptr->mlet == S_CENTAUR) &&
			!amorphous(ptr) && !noncorporeal(ptr) &&
			!is_whirly(ptr) && !unsolid(ptr));
}